

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O0

bool __thiscall testing::internal::FilePath::IsAbsolutePath(FilePath *this)

{
  bool bVar1;
  char *pcVar2;
  char *name;
  FilePath *this_local;
  
  pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (&this->pathname_);
  bVar1 = IsPathSeparator(*pcVar2);
  return bVar1;
}

Assistant:

bool FilePath::IsAbsolutePath() const {
  const char* const name = pathname_.c_str();
#if GTEST_OS_WINDOWS
  return pathname_.length() >= 3 &&
         ((name[0] >= 'a' && name[0] <= 'z') ||
          (name[0] >= 'A' && name[0] <= 'Z')) &&
         name[1] == ':' && IsPathSeparator(name[2]);
#else
  return IsPathSeparator(name[0]);
#endif
}